

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Archive.cpp
# Opt level: O0

bool __thiscall ZAP::Archive::parseHeader(Archive *this)

{
  Archive *this_local;
  
  std::istream::seekg(this->stream,(anonymous_namespace)::MAGIC_POS,DAT_001873b8);
  anon_unknown.dwarf_136a6::readField<unsigned_short>(this->stream,&(this->header).magic);
  anon_unknown.dwarf_136a6::readField<unsigned_char>(this->stream,&(this->header).version);
  anon_unknown.dwarf_136a6::readField<unsigned_char>(this->stream,&(this->header).compression);
  if ((this->header).magic == 0x415a) {
    if ((this->header).version == '\0') {
      this_local._7_1_ = true;
    }
    else {
      this_local._7_1_ = false;
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool Archive::parseHeader()
	{
		// We assume that stream is open
		stream->seekg(MAGIC_POS);
		readField(stream, &header.magic);
		readField(stream, &header.version);
		readField(stream, &header.compression);

		if (header.magic != MAGIC_CHARS)
			return false;
		if (header.version < static_cast<std::uint8_t>(Version::MIN) || header.version > static_cast<std::uint8_t>(Version::MAX))
			return false;

		return true;
	}